

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# command.c
# Opt level: O0

void do_rsset(int *ip)

{
  int iVar1;
  int *ip_local;
  
  labldef(loccnt,1);
  iVar1 = evaluate(ip,';');
  if (iVar1 != 0) {
    if ((value & 0xffff0000) == 0) {
      rsbase = value;
      if (pass == 1) {
        loadlc(value,1);
        println();
      }
    }
    else {
      error("Address out of range!");
    }
  }
  return;
}

Assistant:

void
do_rsset(int *ip)
{
	/* define label */
	labldef(loccnt, 1);

	/* get value */
	if (!evaluate(ip, ';'))
		return;
	if (value & 0xFFFF0000) {
		error("Address out of range!");
		return;
	}

	/* set 'rs' base */
	rsbase = value;

	/* output line */
	if (pass == LAST_PASS) {
		loadlc(rsbase, 1);
		println();
	}
}